

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toggle.cpp
# Opt level: O2

Component ftxui::Toggle(ConstStringListRef entries,int *selected,Ref<ftxui::ToggleOption> *option)

{
  pointer p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *peVar2;
  Ref<ftxui::ToggleOption> *in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Component CVar3;
  __allocator_type __a2;
  allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::ToggleBase,_std::allocator<ftxui::(anonymous_namespace)::ToggleBase>,_(__gnu_cxx::_Lock_policy)2>_>
  local_129;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::ToggleBase,_std::allocator<ftxui::(anonymous_namespace)::ToggleBase>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_128;
  undefined8 local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  Ref<ftxui::ToggleOption> local_108;
  
  peVar2 = (element_type *)entries.ref_;
  p_Var1 = (pointer)operator_new(0x140);
  local_128._M_alloc = &local_129;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  &(p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count)->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00168ca8;
  local_128._M_ptr = p_Var1;
  Ref<ftxui::ToggleOption>::Ref(&local_108,in_R8);
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x18) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x10) = 0;
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__ToggleBase_00168cf8;
  *(vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x28) = entries.ref_wide_;
  *(int **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x30) = selected;
  *(Ref<ftxui::ToggleOption> **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x38) = option;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x50) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x40) = 0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x48) = 0;
  Ref<ftxui::ToggleOption>::Ref
            ((Ref<ftxui::ToggleOption> *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x58),
             &local_108);
  ToggleOption::~ToggleOption(&local_108.owned_);
  local_128._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<ftxui::(anonymous_namespace)::ToggleBase,_std::allocator<ftxui::(anonymous_namespace)::ToggleBase>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_128);
  peVar2->_vptr_ComponentBase = (_func_int **)&p_Var1->_M_impl;
  local_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (peVar2->children_).
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var1;
  local_118 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110);
  CVar3.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar3.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (Component)CVar3.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Toggle(ConstStringListRef entries,
                 int* selected,
                 Ref<ToggleOption> option) {
  return Make<ToggleBase>(entries, selected, std::move(option));
}